

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O1

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  FT_Bool FVar1;
  int iVar2;
  int iVar3;
  PSH_Hint_conflict hint_00;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  FT_Pos FVar10;
  FT_UInt FVar11;
  uint uVar12;
  ulong uVar13;
  FT_Pos *pFVar14;
  FT_Pos FVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  
  uVar20 = hint->flags;
  if ((uVar20 & 8) != 0) {
    return;
  }
  lVar6 = (long)(int)globals->dimension[(uint)dimension].scale_mult;
  iVar2 = hint->org_pos;
  uVar4 = (long)(int)((ulong)(lVar6 * iVar2 + 0x8000 + (lVar6 * iVar2 >> 0x3f)) >> 0x10) +
          globals->dimension[(uint)dimension].scale_delta;
  lVar17 = lVar6 * hint->org_len;
  uVar18 = lVar17 + 0x8000 + (lVar17 >> 0x3f);
  iVar16 = (int)(uVar18 >> 0x10);
  uVar13 = (ulong)iVar16;
  if (((dimension == 0) && (glyph->do_horz_hints == '\0')) ||
     ((dimension == 1 && (glyph->do_vert_hints == '\0')))) {
    hint->cur_pos = uVar4;
    hint->cur_len = uVar13;
    goto LAB_00158351;
  }
  if (dimension == 0) {
    FVar1 = glyph->do_horz_snapping;
LAB_00157f70:
    bVar21 = FVar1 != '\0';
  }
  else {
    if (dimension == 1) {
      FVar1 = glyph->do_vert_snapping;
      goto LAB_00157f70;
    }
    bVar21 = false;
  }
  hint->cur_len = uVar13;
  if (dimension == 1) {
    FVar1 = (globals->blues).no_overshoots;
    FVar11 = (globals->blues).normal_top.count;
    if (FVar11 == 0) {
      FVar15 = 0;
      uVar20 = 0;
    }
    else {
      iVar9 = hint->org_len + iVar2;
      iVar3 = (globals->blues).blue_fuzz;
      pFVar14 = &(globals->blues).normal_top.zones[0].cur_ref;
      do {
        iVar19 = iVar9 - *(FT_Int *)((long)pFVar14 + -4);
        if (SBORROW4(iVar19,-iVar3) != iVar19 + iVar3 < 0) break;
        if (iVar9 <= *(int *)(pFVar14 + -1) + iVar3) {
          if ((FVar1 != '\0') || (iVar19 <= (globals->blues).blue_threshold)) {
            FVar15 = *pFVar14;
            uVar20 = 1;
            goto LAB_0015801d;
          }
          break;
        }
        pFVar14 = pFVar14 + 6;
        FVar11 = FVar11 - 1;
      } while (FVar11 != 0);
      FVar15 = 0;
      uVar20 = 0;
    }
LAB_0015801d:
    uVar7 = (ulong)(globals->blues).normal_bottom.count;
    if (uVar7 == 0) {
      FVar10 = 0;
    }
    else {
      iVar3 = (globals->blues).blue_fuzz;
      pFVar14 = &(globals->blues).normal_bottom.zones[uVar7 - 1].cur_ref;
      do {
        iVar9 = *(int *)(pFVar14 + -1) - iVar2;
        if (SBORROW4(iVar9,-iVar3) != iVar9 + iVar3 < 0) break;
        if (*(FT_Int *)((long)pFVar14 + -4) - iVar3 <= iVar2) {
          if ((FVar1 != '\0') || (iVar9 < (globals->blues).blue_threshold)) {
            uVar20 = uVar20 | 2;
            FVar10 = *pFVar14;
            goto LAB_001580c5;
          }
          break;
        }
        pFVar14 = pFVar14 + -6;
        uVar12 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar12;
      } while (uVar12 != 0);
      FVar10 = 0;
    }
  }
  else {
    FVar15 = 0;
    FVar10 = 0;
    uVar20 = 0;
  }
LAB_001580c5:
  if (uVar20 == 3) {
    hint->cur_pos = FVar10;
    hint->cur_len = FVar15 - FVar10;
  }
  else if (uVar20 == 2) {
    hint->cur_pos = FVar10;
  }
  else if (uVar20 == 1) {
    hint->cur_pos = FVar15 - uVar13;
  }
  else {
    hint_00 = hint->parent;
    if (hint_00 != (PSH_Hint_conflict)0x0) {
      if ((hint_00->flags & 8) == 0) {
        psh_hint_align(hint_00,globals,dimension,glyph);
      }
      lVar6 = lVar6 * ((hint->org_pos - ((hint_00->org_len >> 1) + hint_00->org_pos)) +
                      (hint->org_len >> 1));
      uVar4 = (hint_00->cur_pos - ((long)((uVar18 >> 0x10) << 0x20) >> 0x21)) +
              (hint_00->cur_len >> 1) +
              (long)(int)((ulong)((lVar6 >> 0x3f) + lVar6 + 0x8000) >> 0x10);
    }
    hint->cur_pos = uVar4;
    hint->cur_len = uVar13;
    uVar18 = uVar4;
    if (glyph->do_stem_adjust != '\0') {
      if (iVar16 < 0x41) {
        if (iVar16 < 0x20) {
          uVar7 = uVar4 + 0x20 & 0xffffffffffffffc0;
          uVar18 = uVar7;
          if (0 < iVar16) {
            uVar5 = uVar7 - uVar4;
            uVar18 = uVar4 + uVar13 + 0x20 & 0xffffffffffffffc0;
            uVar8 = uVar18 - (uVar4 + uVar13);
            uVar4 = -uVar5;
            if (0 < (long)uVar5) {
              uVar4 = uVar5;
            }
            uVar5 = -uVar8;
            if (0 < (long)uVar8) {
              uVar5 = uVar8;
            }
            if (uVar4 <= uVar5) {
              uVar18 = uVar7;
            }
          }
        }
        else {
          uVar18 = uVar4 + (uVar13 >> 1) & 0xffffffffffffffc0;
          uVar13 = 0x40;
        }
      }
      else {
        uVar4 = globals->dimension[(uint)dimension].stdw.widths[0].cur;
        uVar5 = uVar13 - uVar4;
        uVar7 = -uVar5;
        if (0 < (long)uVar5) {
          uVar7 = uVar5;
        }
        uVar5 = 0x30;
        if (0x30 < (long)uVar4) {
          uVar5 = uVar4;
        }
        if (uVar7 < 0x28) {
          uVar13 = uVar5;
        }
        if ((long)uVar13 < 0xc0) {
          uVar12 = (uint)uVar13 & 0x3f;
          if (9 < uVar12) {
            if (uVar12 < 0x20) {
              uVar13 = uVar13 & 0x7fffffffffffffc0 | 10;
            }
            else if (uVar12 < 0x36) {
              uVar13 = uVar13 & 0x7fffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          uVar13 = uVar13 + 0x20 & 0x7fffffffffffffc0;
        }
      }
    }
    uVar5 = (uVar18 + 0x20 & 0xffffffffffffffc0) - uVar18;
    uVar7 = ((uVar18 + 0x20 + uVar13 & 0xffffffffffffffc0) - uVar18) - uVar13;
    uVar4 = -uVar5;
    if (0 < (long)uVar5) {
      uVar4 = uVar5;
    }
    uVar8 = -uVar7;
    if (0 < (long)uVar7) {
      uVar8 = uVar7;
    }
    if (uVar4 <= uVar8) {
      uVar7 = uVar5;
    }
    hint->cur_pos = uVar7 + uVar18;
    hint->cur_len = uVar13;
  }
  if (bVar21) {
    uVar13 = 0x40;
    if (0x3f < hint->cur_len) {
      uVar13 = hint->cur_len + 0x20U & 0x7fffffffffffffc0;
    }
    if (uVar20 != 3) {
      if (uVar20 != 2) {
        if (uVar20 == 1) {
          FVar15 = FVar15 - uVar13;
        }
        else {
          hint->cur_len = uVar13;
          uVar4 = uVar13 >> 1;
          if ((uVar13 & 0x40) == 0) {
            uVar18 = hint->cur_pos + uVar4 + 0x20 & 0xffffffffffffffc0;
          }
          else {
            uVar18 = hint->cur_pos + uVar4 & 0xffffffffffffffc0 | 0x20;
          }
          FVar15 = uVar18 - uVar4;
        }
        hint->cur_pos = FVar15;
      }
      hint->cur_len = uVar13;
    }
  }
  uVar20 = hint->flags;
LAB_00158351:
  hint->flags = uVar20 | 8;
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             hint->org_pos + hint->org_len,
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }